

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

VP8StatusCode WebPDecode(uint8_t *data,size_t data_size,WebPDecoderConfig *config)

{
  int iVar1;
  long in_RDX;
  WebPDecParams *in_RSI;
  size_t in_RDI;
  WebPDecBuffer in_mem_buffer;
  VP8StatusCode status;
  WebPDecParams params;
  WebPBitstreamFeatures *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  size_t in_stack_ffffffffffffff00;
  uint8_t *in_stack_ffffffffffffff08;
  WebPDecBuffer *in_stack_ffffffffffffff10;
  WebPDecBuffer *in_stack_ffffffffffffff18;
  VP8StatusCode local_94;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDX == 0) {
    local_94 = VP8_STATUS_INVALID_PARAM;
  }
  else {
    local_94 = GetFeatures(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                           (WebPBitstreamFeatures *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (local_94 == VP8_STATUS_OK) {
      WebPResetDecParams((WebPDecParams *)0x104da2);
      iVar1 = WebPAvoidSlowMemory((WebPDecBuffer *)
                                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                  in_stack_fffffffffffffee8);
      if (iVar1 == 0) {
        local_94 = DecodeInto((uint8_t *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              in_RSI);
      }
      else {
        WebPInitDecBuffer((WebPDecBuffer *)0x104df4);
        local_94 = DecodeInto((uint8_t *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              in_RSI);
        if (local_94 == VP8_STATUS_OK) {
          local_94 = WebPCopyDecBufferPixels(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        }
        WebPFreeDecBuffer((WebPDecBuffer *)0x104e82);
      }
    }
    else if (local_94 == VP8_STATUS_NOT_ENOUGH_DATA) {
      local_94 = VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  return local_94;
}

Assistant:

VP8StatusCode WebPDecode(const uint8_t* data, size_t data_size,
                         WebPDecoderConfig* config) {
  WebPDecParams params;
  VP8StatusCode status;

  if (config == NULL) {
    return VP8_STATUS_INVALID_PARAM;
  }

  status = GetFeatures(data, data_size, &config->input);
  if (status != VP8_STATUS_OK) {
    if (status == VP8_STATUS_NOT_ENOUGH_DATA) {
      return VP8_STATUS_BITSTREAM_ERROR;  // Not-enough-data treated as error.
    }
    return status;
  }

  WebPResetDecParams(&params);
  params.options = &config->options;
  params.output = &config->output;
  if (WebPAvoidSlowMemory(params.output, &config->input)) {
    // decoding to slow memory: use a temporary in-mem buffer to decode into.
    WebPDecBuffer in_mem_buffer;
    WebPInitDecBuffer(&in_mem_buffer);
    in_mem_buffer.colorspace = config->output.colorspace;
    in_mem_buffer.width = config->input.width;
    in_mem_buffer.height = config->input.height;
    params.output = &in_mem_buffer;
    status = DecodeInto(data, data_size, &params);
    if (status == VP8_STATUS_OK) {  // do the slow-copy
      status = WebPCopyDecBufferPixels(&in_mem_buffer, &config->output);
    }
    WebPFreeDecBuffer(&in_mem_buffer);
  } else {
    status = DecodeInto(data, data_size, &params);
  }

  return status;
}